

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O3

string * __thiscall
testing::internal::FlagToEnvVar_abi_cxx11_(string *__return_storage_ptr__,internal *this,char *flag)

{
  ostream *poVar1;
  undefined8 ss;
  int iVar2;
  string *extraout_RAX;
  string *psVar3;
  size_t sVar4;
  pointer pcVar5;
  undefined1 local_60 [8];
  string full_flag;
  char local_31;
  
  Message::Message((Message *)((long)&full_flag.field_2 + 8));
  ss = full_flag.field_2._8_8_;
  poVar1 = (ostream *)(full_flag.field_2._8_8_ + 0x10);
  sVar4 = 6;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"gtest_",6);
  if (this == (internal *)0x0) {
    this = (internal *)"(null)";
  }
  else {
    sVar4 = strlen((char *)this);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)this,sVar4);
  StringStreamToString((string *)local_60,(stringstream *)ss);
  if (ss != 0) {
    (**(code **)(*(long *)ss + 8))(ss);
  }
  Message::Message((Message *)((long)&full_flag.field_2 + 8));
  if (full_flag._M_dataplus._M_p != (pointer)0x0) {
    pcVar5 = (pointer)0x0;
    do {
      iVar2 = toupper((uint)*(byte *)((long)local_60 + (long)pcVar5));
      local_31 = (char)iVar2;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(full_flag.field_2._8_8_ + 0x10),&local_31,1);
      pcVar5 = pcVar5 + 1;
    } while (pcVar5 != full_flag._M_dataplus._M_p);
  }
  StringStreamToString(__return_storage_ptr__,(stringstream *)full_flag.field_2._8_8_);
  if (full_flag.field_2._8_8_ != 0) {
    (**(code **)(*(long *)full_flag.field_2._8_8_ + 8))(full_flag.field_2._8_8_);
  }
  psVar3 = (string *)&full_flag._M_string_length;
  if (local_60 != (undefined1  [8])psVar3) {
    operator_delete((void *)local_60,full_flag._M_string_length + 1);
    psVar3 = extraout_RAX;
  }
  return psVar3;
}

Assistant:

static std::string FlagToEnvVar(const char* flag) {
  const std::string full_flag =
      (Message() << GTEST_FLAG_PREFIX_ << flag).GetString();

  Message env_var;
  for (size_t i = 0; i != full_flag.length(); i++) {
    env_var << ToUpper(full_flag.c_str()[i]);
  }

  return env_var.GetString();
}